

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O3

Ref<embree::XML> __thiscall
embree::parseXML(embree *this,Ref<embree::Stream<embree::Token>_> *cin,size_t depth)

{
  pointer pcVar1;
  ssize_t sVar2;
  bool bVar3;
  XML *pXVar4;
  Token *pTVar5;
  runtime_error *prVar6;
  long *plVar7;
  size_type *psVar8;
  Ref<embree::XML> *xml;
  undefined1 local_288 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_270;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_258;
  XML *local_240;
  Token local_238;
  XML *local_1f0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1e8;
  size_t local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_1f0 = (XML *)this;
  local_1e0 = depth;
  if (0x400 < depth) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    pTVar5 = Stream<embree::Token>::peek(cin->ptr);
    ParseLocation::str_abi_cxx11_((string *)&local_238,&pTVar5->loc);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_238);
    local_288._0_8_ = *plVar7;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_288._0_8_ == psVar8) {
      local_288._16_8_ = *psVar8;
      aStack_270._M_allocated_capacity = plVar7[3];
      local_288._0_8_ = local_288 + 0x10;
    }
    else {
      local_288._16_8_ = *psVar8;
    }
    local_288._8_8_ = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::runtime_error::runtime_error(prVar6,(string *)local_288);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pXVar4 = (XML *)operator_new(0xb0);
  local_288._0_8_ = local_288 + 0x10;
  local_240 = pXVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"");
  XML::XML(pXVar4,(string *)local_288);
  (local_1f0->super_RefCount)._vptr_RefCount = (_func_int **)pXVar4;
  (*(pXVar4->super_RefCount)._vptr_RefCount[2])(pXVar4);
  if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
    operator_delete((void *)local_288._0_8_);
  }
  pTVar5 = Stream<embree::Token>::peek(cin->ptr);
  (pXVar4->loc).fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (pTVar5->loc).fileName.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pXVar4->loc).fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(pTVar5->loc).fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  sVar2 = (pTVar5->loc).colNumber;
  (pXVar4->loc).lineNumber = (pTVar5->loc).lineNumber;
  (pXVar4->loc).colNumber = sVar2;
  Stream<embree::Token>::get((Token *)local_288,cin->ptr);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"<","");
  Token::Sym(&local_238,&local_70);
  bVar3 = operator==((Token *)local_288,&local_238);
  if (local_238.loc.fileName.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_238.loc.fileName.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_238.str._M_dataplus._M_p != (pointer)((long)&local_238 + 0x18U)) {
    operator_delete(local_238.str._M_dataplus._M_p);
  }
  pXVar4 = local_240;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._8_8_ != &aStack_270) {
    operator_delete((void *)local_288._8_8_);
  }
  if (!bVar3) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    pTVar5 = Stream<embree::Token>::unget(cin->ptr,1);
    ParseLocation::str_abi_cxx11_((string *)&local_238,&pTVar5->loc);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_238);
    local_288._0_8_ = *plVar7;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_288._0_8_ == psVar8) {
      local_288._16_8_ = *psVar8;
      aStack_270._M_allocated_capacity = plVar7[3];
      local_288._0_8_ = local_288 + 0x10;
    }
    else {
      local_288._16_8_ = *psVar8;
    }
    local_288._8_8_ = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::runtime_error::runtime_error(prVar6,(string *)local_288);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Stream<embree::Token>::get((Token *)local_288,cin->ptr);
  Token::Identifier_abi_cxx11_((string *)&local_238,(Token *)local_288);
  local_1d8 = &pXVar4->name;
  std::__cxx11::string::operator=((string *)local_1d8,(string *)&local_238);
  if ((pointer)local_238._0_8_ != (pointer)((long)&local_238 + 0x10U)) {
    operator_delete((void *)local_238._0_8_);
  }
  if (local_258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._8_8_ != &aStack_270) {
    operator_delete((void *)local_288._8_8_);
  }
  parseComments(cin);
  local_1e8 = &pXVar4->parms;
  while( true ) {
    pTVar5 = Stream<embree::Token>::peek(cin->ptr);
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"/>","");
    Token::Sym((Token *)local_288,&local_170);
    bVar3 = operator==(pTVar5,(Token *)local_288);
    if (bVar3) {
      bVar3 = false;
    }
    else {
      pTVar5 = Stream<embree::Token>::peek(cin->ptr);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,">","");
      Token::Sym(&local_238,&local_190);
      bVar3 = operator==(pTVar5,&local_238);
      if (local_238.loc.fileName.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_238.loc.fileName.
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_238.str._M_dataplus._M_p != (pointer)((long)&local_238 + 0x18U)) {
        operator_delete(local_238.str._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      bVar3 = !bVar3;
    }
    if (local_258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._8_8_ != &aStack_270) {
      operator_delete((void *)local_288._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if (!bVar3) break;
    parseParm(cin,local_1e8);
    parseComments(cin);
  }
  pTVar5 = Stream<embree::Token>::peek(cin->ptr);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"/>","");
  Token::Sym((Token *)local_288,&local_90);
  bVar3 = operator==(pTVar5,(Token *)local_288);
  if (local_258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._8_8_ != &aStack_270) {
    operator_delete((void *)local_288._8_8_);
  }
  pXVar4 = local_240;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (bVar3) {
    Stream<embree::Token>::drop(cin->ptr);
  }
  else {
    Stream<embree::Token>::drop(cin->ptr);
    parseComments(cin);
    local_1e8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&pXVar4->body;
    while( true ) {
      pTVar5 = Stream<embree::Token>::peek(cin->ptr);
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"<","");
      Token::Sym((Token *)local_288,&local_1b0);
      bVar3 = operator==(pTVar5,(Token *)local_288);
      if (bVar3) {
        bVar3 = false;
      }
      else {
        pTVar5 = Stream<embree::Token>::peek(cin->ptr);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"</","");
        Token::Sym(&local_238,&local_1d0);
        bVar3 = operator==(pTVar5,&local_238);
        if (local_238.loc.fileName.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_238.loc.fileName.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (local_238.str._M_dataplus._M_p != (pointer)((long)&local_238 + 0x18U)) {
          operator_delete(local_238.str._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        bVar3 = !bVar3;
      }
      if (local_258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._8_8_ != &aStack_270) {
        operator_delete((void *)local_288._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      if (!bVar3) break;
      Stream<embree::Token>::get((Token *)local_288,cin->ptr);
      std::vector<embree::Token,_std::allocator<embree::Token>_>::emplace_back<embree::Token>
                ((vector<embree::Token,_std::allocator<embree::Token>_> *)local_1e8,
                 (Token *)local_288);
      if (local_258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._8_8_ != &aStack_270) {
        operator_delete((void *)local_288._8_8_);
      }
      parseComments(cin);
    }
    pTVar5 = Stream<embree::Token>::peek(cin->ptr);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"<","");
    Token::Sym((Token *)local_288,&local_b0);
    bVar3 = operator==(pTVar5,(Token *)local_288);
    if (local_258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258._M_pi);
    }
    pXVar4 = local_240;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._8_8_ != &aStack_270) {
      operator_delete((void *)local_288._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (bVar3) {
      local_1e0 = local_1e0 + 1;
      while( true ) {
        pTVar5 = Stream<embree::Token>::peek(cin->ptr);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"</","");
        Token::Sym((Token *)local_288,&local_d0);
        bVar3 = operator==(pTVar5,(Token *)local_288);
        if (local_258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._8_8_ != &aStack_270) {
          operator_delete((void *)local_288._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if (bVar3) break;
        parseXML((embree *)local_288,cin,local_1e0);
        std::vector<embree::Ref<embree::XML>,std::allocator<embree::Ref<embree::XML>>>::
        emplace_back<embree::Ref<embree::XML>>
                  ((vector<embree::Ref<embree::XML>,std::allocator<embree::Ref<embree::XML>>> *)
                   &pXVar4->children,(Ref<embree::XML> *)local_288);
        if ((long *)local_288._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_288._0_8_ + 0x18))();
        }
        parseComments(cin);
      }
    }
    Stream<embree::Token>::get((Token *)local_288,cin->ptr);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"</","");
    Token::Sym(&local_238,&local_f0);
    bVar3 = operator==((Token *)local_288,&local_238);
    if (local_238.loc.fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_238.loc.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_238.str._M_dataplus._M_p != (pointer)((long)&local_238 + 0x18U)) {
      operator_delete(local_238.str._M_dataplus._M_p);
    }
    pXVar4 = local_240;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (local_258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._8_8_ != &aStack_270) {
      operator_delete((void *)local_288._8_8_);
    }
    if (!bVar3) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      pTVar5 = Stream<embree::Token>::unget(cin->ptr,1);
      ParseLocation::str_abi_cxx11_((string *)&local_238,&pTVar5->loc);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_288._0_8_ = *plVar7;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_288._0_8_ == psVar8) {
        local_288._16_8_ = *psVar8;
        aStack_270._M_allocated_capacity = plVar7[3];
        local_288._0_8_ = local_288 + 0x10;
      }
      else {
        local_288._16_8_ = *psVar8;
      }
      local_288._8_8_ = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::runtime_error::runtime_error(prVar6,(string *)local_288);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Stream<embree::Token>::get((Token *)local_288,cin->ptr);
    pcVar1 = (pXVar4->name)._M_dataplus._M_p;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar1,pcVar1 + (pXVar4->name)._M_string_length);
    Token::Id(&local_238,&local_110);
    bVar3 = operator==((Token *)local_288,&local_238);
    if (local_238.loc.fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_238.loc.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_238.str._M_dataplus._M_p != (pointer)((long)&local_238 + 0x18U)) {
      operator_delete(local_238.str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if (local_258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._8_8_ != &aStack_270) {
      operator_delete((void *)local_288._8_8_);
    }
    if (!bVar3) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      pTVar5 = Stream<embree::Token>::unget(cin->ptr,1);
      ParseLocation::str_abi_cxx11_(&local_50,&pTVar5->loc);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_130._M_dataplus._M_p = (pointer)*plVar7;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_130._M_dataplus._M_p == psVar8) {
        local_130.field_2._M_allocated_capacity = *psVar8;
        local_130.field_2._8_8_ = plVar7[3];
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar8;
      }
      local_130._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238
                     ,&local_130,local_1d8);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_288._0_8_ = *plVar7;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_288._0_8_ == psVar8) {
        local_288._16_8_ = *psVar8;
        aStack_270._M_allocated_capacity = plVar7[3];
        local_288._0_8_ = local_288 + 0x10;
      }
      else {
        local_288._16_8_ = *psVar8;
      }
      local_288._8_8_ = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::runtime_error::runtime_error(prVar6,(string *)local_288);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Stream<embree::Token>::get((Token *)local_288,cin->ptr);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,">","");
    Token::Sym(&local_238,&local_150);
    bVar3 = operator==((Token *)local_288,&local_238);
    if (local_238.loc.fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_238.loc.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_238.str._M_dataplus._M_p != (pointer)((long)&local_238 + 0x18U)) {
      operator_delete(local_238.str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if (local_258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._8_8_ != &aStack_270) {
      operator_delete((void *)local_288._8_8_);
    }
    if (!bVar3) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      pTVar5 = Stream<embree::Token>::unget(cin->ptr,1);
      ParseLocation::str_abi_cxx11_((string *)&local_238,&pTVar5->loc);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_288._0_8_ = *plVar7;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_288._0_8_ == psVar8) {
        local_288._16_8_ = *psVar8;
        aStack_270._M_allocated_capacity = plVar7[3];
        local_288._0_8_ = local_288 + 0x10;
      }
      else {
        local_288._16_8_ = *psVar8;
      }
      local_288._8_8_ = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::runtime_error::runtime_error(prVar6,(string *)local_288);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return (Ref<embree::XML>)local_1f0;
}

Assistant:

Ref<XML> parseXML(Ref<Stream<Token> >& cin, size_t depth)
  {
    if (depth > 1024)
      THROW_RUNTIME_ERROR(cin->peek().Location().str()+": maximal nesting depth reached");
      
    Ref<XML> xml = new XML;
    xml->loc = cin->peek().Location();

    /* parse tag opening */
    if (cin->get() != Token::Sym("<")) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": tag expected");

    xml->name = cin->get().Identifier();
    parseComments(cin);
    while (cin->peek() != Token::Sym("/>") && cin->peek() != Token::Sym(">")) {
      parseParm(cin,xml->parms);
      parseComments(cin);
    }
    if (cin->peek() == Token::Sym("/>")) {
      cin->drop();
      return xml;
    }
    cin->drop();

    /* parse body token list */
    parseComments(cin);
    while (cin->peek() != Token::Sym("<") && cin->peek() != Token::Sym("</")) {
      xml->body.push_back(cin->get());
      parseComments(cin);
    }

    /* the body also contains children */
    if (cin->peek() == Token::Sym("<")) {
      while (cin->peek() != Token::Sym("</")) {
        xml->children.push_back(parseXML(cin,depth+1));
        parseComments(cin);
      }
    }

    /* parse tag closing */
    if (cin->get() != Token::Sym("</")    ) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": symbol \"</\" expected");
    if (cin->get() != Token::Id(xml->name)) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": closing "+xml->name+" expected");
    if (cin->get() != Token::Sym(">")     ) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": symbol \">\" expected");

    return xml;
  }